

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void RD4(uint8_t *dst,uint8_t *top)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int D;
  int C;
  int B;
  int A;
  int L;
  int K;
  int J;
  int I;
  int X;
  uint8_t *top_local;
  uint8_t *dst_local;
  
  uVar5 = (uint)top[-1];
  uVar6 = (uint)top[-2];
  uVar7 = (uint)top[-3];
  bVar1 = top[-4];
  uVar8 = (uint)*top;
  uVar9 = (uint)top[1];
  bVar2 = top[2];
  bVar3 = top[3];
  dst[0x60] = (uint8_t)((int)(uVar7 + (uint)bVar1 * 2 + (uint)top[-5] + 2) >> 2);
  uVar4 = (uint8_t)((int)(uVar6 + uVar7 * 2 + (uint)bVar1 + 2) >> 2);
  dst[0x61] = uVar4;
  dst[0x40] = uVar4;
  uVar4 = (uint8_t)((int)(uVar5 + uVar6 * 2 + uVar7 + 2) >> 2);
  dst[0x62] = uVar4;
  dst[0x41] = uVar4;
  dst[0x20] = uVar4;
  uVar4 = (uint8_t)((int)(uVar8 + uVar5 * 2 + uVar6 + 2) >> 2);
  dst[99] = uVar4;
  dst[0x42] = uVar4;
  dst[0x21] = uVar4;
  *dst = uVar4;
  uVar4 = (uint8_t)((int)(uVar9 + uVar8 * 2 + uVar5 + 2) >> 2);
  dst[0x43] = uVar4;
  dst[0x22] = uVar4;
  dst[1] = uVar4;
  uVar4 = (uint8_t)((int)((uint)bVar2 + uVar9 * 2 + uVar8 + 2) >> 2);
  dst[0x23] = uVar4;
  dst[2] = uVar4;
  dst[3] = (uint8_t)((int)((uint)bVar3 + (uint)bVar2 * 2 + uVar9 + 2) >> 2);
  return;
}

Assistant:

static void RD4(uint8_t* dst, const uint8_t* top) {
  const int X = top[-1];
  const int I = top[-2];
  const int J = top[-3];
  const int K = top[-4];
  const int L = top[-5];
  const int A = top[0];
  const int B = top[1];
  const int C = top[2];
  const int D = top[3];
  DST(0, 3)                                     = AVG3(J, K, L);
  DST(0, 2) = DST(1, 3)                         = AVG3(I, J, K);
  DST(0, 1) = DST(1, 2) = DST(2, 3)             = AVG3(X, I, J);
  DST(0, 0) = DST(1, 1) = DST(2, 2) = DST(3, 3) = AVG3(A, X, I);
  DST(1, 0) = DST(2, 1) = DST(3, 2)             = AVG3(B, A, X);
  DST(2, 0) = DST(3, 1)                         = AVG3(C, B, A);
  DST(3, 0)                                     = AVG3(D, C, B);
}